

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool FindLastLI(Node *list,Node **lastli)

{
  Node *local_20;
  Node *node;
  Node **lastli_local;
  Node *list_local;
  
  *lastli = (Node *)0x0;
  for (local_20 = list->content; local_20 != (Node *)0x0; local_20 = local_20->next) {
    if ((((local_20 != (Node *)0x0) && (local_20->tag != (Dict *)0x0)) &&
        (local_20->tag->id == TidyTag_LI)) && (local_20->type == StartTag)) {
      *lastli = local_20;
    }
  }
  return (uint)(*lastli != (Node *)0x0);
}

Assistant:

static Bool FindLastLI( Node *list, Node **lastli )
{
    Node *node;

    *lastli = NULL;
    for ( node = list->content; node ; node = node->next )
        if ( nodeIsLI(node) && node->type == StartTag )
            *lastli=node;
    return *lastli ? yes:no;
}